

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-optimizer-common.hpp
# Opt level: O1

void __thiscall
baryonyx::itm::
best_solution_recorder<baryonyx::itm::default_cost_type<double>,_double,_baryonyx::itm::maximize_tag>
::try_advance(best_solution_recorder<baryonyx::itm::default_cost_type<double>,_double,_baryonyx::itm::maximize_tag>
              *this,local_context *ctx,bit_array *solution,int remaining_constraints,long loop)

{
  bool bVar1;
  size_t hash;
  long lVar2;
  bit_array_hash local_39;
  long local_38;
  
  local_38 = loop;
  hash = bit_array_hash::operator()(&local_39,solution);
  bVar1 = storage<baryonyx::itm::default_cost_type<double>,_baryonyx::itm::maximize_tag>::
          can_be_inserted(&this->m_storage,hash,remaining_constraints);
  if (bVar1) {
    lVar2 = std::chrono::_V2::steady_clock::now();
    storage<baryonyx::itm::default_cost_type<double>,_baryonyx::itm::maximize_tag>::insert
              (&this->m_storage,ctx,solution,hash,remaining_constraints,
               (double)(lVar2 - (this->m_start).__d.__r) / 1000000000.0,local_38);
  }
  return;
}

Assistant:

void try_advance(local_context& ctx,
                     const bit_array& solution,
                     const int remaining_constraints,
                     const long int loop)
    {
        auto hash = bit_array_hash()(solution);

        if (m_storage.can_be_inserted(hash, remaining_constraints)) {
            const auto end = std::chrono::steady_clock::now();
            const auto duration = compute_duration(m_start, end);

            m_storage.insert(
              ctx, solution, hash, remaining_constraints, duration, loop);
        }
    }